

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desc_sroa.h
# Opt level: O2

void __thiscall
spvtools::opt::DescriptorScalarReplacement::DescriptorScalarReplacement
          (DescriptorScalarReplacement *this,bool flatten_composites,bool flatten_arrays)

{
  _Rb_tree_header *p_Var1;
  
  Pass::Pass(&this->super_Pass);
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__DescriptorScalarReplacement_008af0c8;
  p_Var1 = &(this->replacement_variables_)._M_t._M_impl.super__Rb_tree_header;
  (this->replacement_variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->replacement_variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->replacement_variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->replacement_variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->replacement_variables_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->flatten_composites_ = flatten_composites;
  this->flatten_arrays_ = flatten_arrays;
  return;
}

Assistant:

DescriptorScalarReplacement(bool flatten_composites, bool flatten_arrays)
      : flatten_composites_(flatten_composites),
        flatten_arrays_(flatten_arrays) {}